

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isAllowedInPackage(SyntaxKind kind)

{
  bool bVar1;
  
  if (((1 < kind - PackageExportAllDeclaration) && (kind != AnonymousProgram)) &&
     (kind != TimeUnitsDeclaration)) {
    bVar1 = isModuleOrPackageDecl(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isAllowedInPackage(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::PackageExportDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
        case SyntaxKind::AnonymousProgram:
            return true;
        default:
            return isModuleOrPackageDecl(kind);
    }
}